

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

void If_ManCreateChoice(If_Man_t *p,If_Obj_t *pObj)

{
  undefined4 uVar1;
  undefined4 uVar2;
  If_Obj_t *pIVar3;
  uint uVar4;
  uint uVar5;
  
  if (-1 < (char)*(uint *)pObj) {
    *(uint *)pObj = *(uint *)pObj | 0x80;
    pIVar3 = pObj;
    do {
      uVar4 = *(uint *)pObj >> 0xd;
      uVar5 = *(uint *)pIVar3 >> 0xd;
      if (*(uint *)pIVar3 >> 0xd < uVar4) {
        uVar5 = uVar4;
      }
      *(uint *)pObj = *(uint *)pObj & 0x1fff | uVar5 << 0xd;
      uVar1 = pIVar3->nVisits;
      uVar2 = pIVar3->nVisitsCopy;
      pIVar3->nVisits = uVar1 + 1;
      pIVar3->nVisitsCopy = uVar2 + 1;
      pIVar3 = pIVar3->pEquiv;
    } while (pIVar3 != (If_Obj_t *)0x0);
    if (p->nLevelMax < (int)(*(uint *)pObj >> 0xd)) {
      p->nLevelMax = *(uint *)pObj >> 0xd;
    }
    p->nChoices = p->nChoices + 1;
    return;
  }
  __assert_fail("pObj->fRepr == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                ,0x1ce,"void If_ManCreateChoice(If_Man_t *, If_Obj_t *)");
}

Assistant:

void If_ManCreateChoice( If_Man_t * p, If_Obj_t * pObj )
{
    If_Obj_t * pTemp;
    // mark the node as a representative if its class
    assert( pObj->fRepr == 0 );
    pObj->fRepr = 1;
    // update the level of this node (needed for correct required time computation)
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
    {
        pObj->Level = IF_MAX( pObj->Level, pTemp->Level );
        pTemp->nVisits++; pTemp->nVisitsCopy++;
    }
    // mark the largest level
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nChoices++;
}